

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O3

void __thiscall
soul::ResolutionPass::GenericFunctionResolver::throwResolutionError
          (GenericFunctionResolver *this,CallOrCast *call,Function *function,Context *errorLocation,
          string *errorMessage)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  SourceCodeText *pSVar2;
  string *psVar3;
  pointer pcVar4;
  long *plVar5;
  undefined8 *puVar6;
  size_type *psVar7;
  CompileMessageGroup messages;
  string local_1b8;
  CompileMessage local_198;
  string local_160;
  string local_140;
  undefined1 local_120 [248];
  
  local_120._0_8_ = local_120 + 0x18;
  local_120._8_8_ = 0;
  local_120._16_8_ = 4;
  pSVar2 = (function->super_ASTObject).context.location.sourceCode.object;
  if (pSVar2 == (SourceCodeText *)0x0) {
    throwInternalCompilerError("object != nullptr","operator->",0x47);
  }
  if (pSVar2->isInternal == true) {
    psVar3 = (function->name).name;
    if (psVar3 == (string *)0x0) {
      throwInternalCompilerError("isValid()","operator const std::basic_string<char> &",0x21);
    }
    pcVar4 = (psVar3->_M_dataplus)._M_p;
    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_140,pcVar4,pcVar4 + psVar3->_M_string_length);
    AST::CallOrCastBase::getDescription(&local_1b8,&call->super_CallOrCastBase,&local_140);
    plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_1b8,0,(char *)0x0,0x27d3e3);
    local_198.description._M_dataplus._M_p = (pointer)*plVar5;
    psVar7 = (size_type *)(plVar5 + 2);
    if ((size_type *)local_198.description._M_dataplus._M_p == psVar7) {
      local_198.description.field_2._M_allocated_capacity = *psVar7;
      local_198.description.field_2._8_8_ = plVar5[3];
      local_198.description._M_dataplus._M_p = (pointer)&local_198.description.field_2;
    }
    else {
      local_198.description.field_2._M_allocated_capacity = *psVar7;
    }
    local_198.description._M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    local_198.location.sourceCode.object =
         (call->super_CallOrCastBase).super_Expression.super_Statement.super_ASTObject.context.
         location.sourceCode.object;
    if (local_198.location.sourceCode.object != (SourceCodeText *)0x0) {
      ((local_198.location.sourceCode.object)->super_RefCountedObject).refCount =
           ((local_198.location.sourceCode.object)->super_RefCountedObject).refCount + 1;
    }
    local_198.location.location.data =
         (call->super_CallOrCastBase).super_Expression.super_Statement.super_ASTObject.context.
         location.location.data;
    local_198.type = error;
    local_198.category = none;
    ArrayWithPreallocation<soul::CompileMessage,_4UL>::push_back
              ((ArrayWithPreallocation<soul::CompileMessage,_4UL> *)local_120,&local_198);
    CompileMessage::~CompileMessage(&local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    psVar3 = (function->name).name;
    if (psVar3 == (string *)0x0) {
      throwInternalCompilerError("isValid()","operator const std::basic_string<char> &",0x21);
    }
    pcVar4 = (psVar3->_M_dataplus)._M_p;
    local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_160,pcVar4,pcVar4 + psVar3->_M_string_length);
    AST::CallOrCastBase::getDescription(&local_1b8,&call->super_CallOrCastBase,&local_160);
    puVar6 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_1b8,0,(char *)0x0,0x27d417);
    paVar1 = &local_198.description.field_2;
    local_198.description._M_dataplus._M_p = (pointer)*puVar6;
    psVar7 = puVar6 + 2;
    if ((size_type *)local_198.description._M_dataplus._M_p == psVar7) {
      local_198.description.field_2._M_allocated_capacity = *psVar7;
      local_198.description.field_2._8_8_ = puVar6[3];
      local_198.description._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_198.description.field_2._M_allocated_capacity = *psVar7;
    }
    local_198.description._M_string_length = puVar6[1];
    *puVar6 = psVar7;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    local_198.location.sourceCode.object =
         (call->super_CallOrCastBase).super_Expression.super_Statement.super_ASTObject.context.
         location.sourceCode.object;
    if (local_198.location.sourceCode.object != (SourceCodeText *)0x0) {
      ((local_198.location.sourceCode.object)->super_RefCountedObject).refCount =
           ((local_198.location.sourceCode.object)->super_RefCountedObject).refCount + 1;
    }
    local_198.location.location.data =
         (call->super_CallOrCastBase).super_Expression.super_Statement.super_ASTObject.context.
         location.location.data;
    local_198.type = error;
    local_198.category = none;
    ArrayWithPreallocation<soul::CompileMessage,_4UL>::push_back
              ((ArrayWithPreallocation<soul::CompileMessage,_4UL> *)local_120,&local_198);
    CompileMessage::~CompileMessage(&local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
    pcVar4 = (errorMessage->_M_dataplus)._M_p;
    local_198.description._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_198,pcVar4,pcVar4 + errorMessage->_M_string_length);
    local_198.location.sourceCode.object = (errorLocation->location).sourceCode.object;
    if (local_198.location.sourceCode.object != (SourceCodeText *)0x0) {
      ((local_198.location.sourceCode.object)->super_RefCountedObject).refCount =
           ((local_198.location.sourceCode.object)->super_RefCountedObject).refCount + 1;
    }
    local_198.location.location.data = (errorLocation->location).location.data;
    local_198.type = error;
    local_198.category = none;
    ArrayWithPreallocation<soul::CompileMessage,_4UL>::push_back
              ((ArrayWithPreallocation<soul::CompileMessage,_4UL> *)local_120,&local_198);
    CompileMessage::~CompileMessage(&local_198);
  }
  throwError((CompileMessageGroup *)local_120);
}

Assistant:

OperatorResolver (ResolutionPass& rp, bool shouldIgnoreErrors)
            : super (rp, shouldIgnoreErrors) {}